

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::train(FastText *this,Args *args)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  invalid_argument *piVar4;
  element_type *peVar5;
  shared_ptr<fasttext::Matrix> *__args_1;
  long lVar6;
  element_type *peVar7;
  long in_RDI;
  shared_ptr<fasttext::Matrix> *__args_2;
  string *in_stack_000000f8;
  FastText *in_stack_00000100;
  ifstream wfs;
  ifstream ifs;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffa28;
  Model *in_stack_fffffffffffffa30;
  Matrix *in_stack_fffffffffffffa40;
  element_type *in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  real in_stack_fffffffffffffa5c;
  Matrix *this_00;
  entry_type type;
  Dictionary *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  FastText *in_stack_fffffffffffffac0;
  istream *in_stack_fffffffffffffac8;
  Dictionary *in_stack_fffffffffffffad0;
  undefined1 local_4d0 [55];
  undefined1 local_499;
  string local_498 [32];
  undefined1 local_478 [527];
  undefined1 local_269;
  string local_268 [32];
  undefined1 local_248 [584];
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>
            ((Args *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffa30,
             (shared_ptr<fasttext::Args> *)in_stack_fffffffffffffa28);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x16722e);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffa30,
             (shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffa28);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x167269);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x167276);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffa30,(char *)in_stack_fffffffffffffa28);
  if (bVar1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Cannot use stdin for training!");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1672f6);
  std::ifstream::ifstream(local_248,(string *)peVar3,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_269 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x167352);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                   (char *)in_stack_fffffffffffffa50);
    std::invalid_argument::invalid_argument(piVar4,local_268);
    local_269 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x167420);
  Dictionary::readFromFile(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::ifstream::close();
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16744e);
  std::ifstream::ifstream(local_478,(string *)&peVar3->weights,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_499 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1674ae);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                   (char *)in_stack_fffffffffffffa50);
    std::invalid_argument::invalid_argument(piVar4,local_498);
    local_499 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar5 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x167580);
  __args_1 = (shared_ptr<fasttext::Matrix> *)Dictionary::nids(peVar5);
  local_4d0._20_4_ = 1;
  local_4d0._24_8_ = __args_1;
  std::make_shared<fasttext::Matrix,long,int>
            ((long *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
             (int *)in_stack_fffffffffffffa50);
  __args_2 = (shared_ptr<fasttext::Matrix> *)(in_RDI + 0x40);
  this_00 = (Matrix *)(local_4d0 + 0x20);
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_fffffffffffffa30->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffa28);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1675f3);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1675fd);
  Matrix::load((Matrix *)CONCAT17(bVar2,in_stack_fffffffffffffa80),
               (istream *)in_stack_fffffffffffffa78);
  std::ifstream::close();
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16762b);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 == 0) {
    peVar5 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16767c);
    in_stack_fffffffffffffa5c = (real)Dictionary::nwords(peVar5);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x167697);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1676ba);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
               (int *)in_stack_fffffffffffffa50);
    in_stack_fffffffffffffa40 = (Matrix *)local_4d0;
    std::shared_ptr<fasttext::Matrix>::operator=
              (&in_stack_fffffffffffffa30->wi_,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffa28);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x167705);
    in_stack_fffffffffffffa50 =
         std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x16770f);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x167721);
    Matrix::uniform(this_00,in_stack_fffffffffffffa5c);
  }
  else {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16764d);
    loadVectors(in_stack_00000100,in_stack_000000f8);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x167751);
  if (peVar3->model == sup) {
    peVar5 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16776b);
    Dictionary::nlabels(peVar5);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x167791);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
               (int *)in_stack_fffffffffffffa50);
    std::shared_ptr<fasttext::Matrix>::operator=
              (&in_stack_fffffffffffffa30->wi_,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffa28);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1677d5);
  }
  else {
    peVar5 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1677e8);
    Dictionary::nwords(peVar5);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16780e);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
               (int *)in_stack_fffffffffffffa50);
    std::shared_ptr<fasttext::Matrix>::operator=
              (&in_stack_fffffffffffffa30->wi_,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffa28);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x167852);
  }
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x167863);
  Matrix::zero(in_stack_fffffffffffffa40);
  startThreads(in_stack_fffffffffffffac0);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffa78,__args_1,__args_2,
             (shared_ptr<fasttext::Args> *)this_00,
             (int *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  type = (entry_type)((ulong)__args_1 >> 0x38);
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)in_stack_fffffffffffffa30,
             (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffa28);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1678e1);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1678ee);
  if (peVar3->model == sup) {
    peVar7 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16790c);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x167922);
    Dictionary::getCounts(in_stack_fffffffffffffa78,type);
    Model::setTargetCounts(peVar7,in_stack_fffffffffffffa28);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa40);
  }
  else {
    peVar7 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x167996);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1679ab);
    Dictionary::getCounts(in_stack_fffffffffffffa78,type);
    Model::setTargetCounts(in_stack_fffffffffffffa30,(vector<long,_std::allocator<long>_> *)peVar7);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa40);
  }
  std::ifstream::~ifstream(local_478);
  std::ifstream::~ifstream(local_248);
  return;
}

Assistant:

void FastText::train(const Args& args) {
	args_ = std::make_shared<Args>(args);
	dict_ = std::make_shared<Dictionary>(args_);
	if (args_->input == "-") {
		// manage expectations
		throw std::invalid_argument("Cannot use stdin for training!");
	}
	std::ifstream ifs(args_->input);
	if (!ifs.is_open()) {
		throw std::invalid_argument(
				args_->input + " cannot be opened for training!");
	}
	dict_->readFromFile(ifs);
	ifs.close();
	std::ifstream wfs(args_->weights);
	if (!wfs.is_open()) {
		throw std::invalid_argument(
				args_->weights + " cannot be opened for weights!");
	}
	weights_ = std::make_shared<Matrix>(dict_->nids(),1);
	weights_->load(wfs);
	wfs.close();
	// weights_->load(0);
	if (args_->pretrainedVectors.size() != 0) {
		loadVectors(args_->pretrainedVectors);
		// std::cerr << "Number of words:  " << dict_->nwords() << std::endl;
	} else {
		input_ =
				std::make_shared<Matrix>(dict_->nwords() + args_->bucket, args_->dim);
		input_->uniform(1.0 / args_->dim);
	}

	if (args_->model == model_name::sup) {
		output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
	} else {
		output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
	}
	output_->zero();
	startThreads();
	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}